

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O1

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
unaryExpression(Tokenizer *tokenizer)

{
  TokenType TVar1;
  undefined8 __p;
  Token *pTVar2;
  ExpressionInternal *this;
  Tokenizer *in_RSI;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  undefined1 local_30 [16];
  
  postfixExpression((Tokenizer *)local_30);
  if ((pointer)local_30._0_8_ == (pointer)0x0) {
    pTVar2 = Tokenizer::nextToken(in_RSI);
    TVar1 = pTVar2->type;
    postfixExpression((Tokenizer *)(local_30 + 8));
    __p = local_30._8_8_;
    local_30._8_8_ = (pointer)0x0;
    std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
              ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               local_30,(pointer)__p);
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               (local_30 + 8));
    if ((pointer)local_30._0_8_ == (pointer)0x0) {
LAB_00145177:
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)0x0;
      goto LAB_001451ef;
    }
    if ((int)TVar1 < 0xd) {
      if (TVar1 == Plus) goto LAB_0014508a;
      if (TVar1 != Minus) goto LAB_00145177;
      this = (ExpressionInternal *)operator_new(0x50);
      local_30._8_8_ = local_30._0_8_;
      local_30._0_8_ =
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
      ExpressionInternal::
      ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                (this,Neg,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)(local_30 + 8));
    }
    else if (TVar1 == Tilde) {
      this = (ExpressionInternal *)operator_new(0x50);
      local_30._8_8_ = local_30._0_8_;
      local_30._0_8_ =
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
      ExpressionInternal::
      ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                (this,BitNot,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_30 + 8));
    }
    else if (TVar1 == Exclamation) {
      this = (ExpressionInternal *)operator_new(0x50);
      local_30._8_8_ = local_30._0_8_;
      local_30._0_8_ =
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
      ExpressionInternal::
      ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                (this,LogNot,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_30 + 8));
    }
    else {
      if (TVar1 != Degree) goto LAB_00145177;
      this = (ExpressionInternal *)operator_new(0x50);
      local_30._8_8_ = local_30._0_8_;
      local_30._0_8_ =
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
      ExpressionInternal::
      ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                (this,ToString,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_30 + 8));
    }
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)this;
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               (local_30 + 8));
  }
  else {
LAB_0014508a:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)local_30._0_8_;
    local_30._0_8_ =
         (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
  }
LAB_001451ef:
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_30);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> unaryExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = postfixExpression(tokenizer);
	if (exp != nullptr)
		return exp;

	const TokenType opType = tokenizer.nextToken().type;
	exp = postfixExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	switch (opType)
	{
	case TokenType::Plus:
		return exp;
	case TokenType::Minus:
		return std::make_unique<ExpressionInternal>(OperatorType::Neg, std::move(exp));
	case TokenType::Tilde:
		return std::make_unique<ExpressionInternal>(OperatorType::BitNot, std::move(exp));
	case TokenType::Exclamation:
		return std::make_unique<ExpressionInternal>(OperatorType::LogNot, std::move(exp));
	case TokenType::Degree:
		return std::make_unique<ExpressionInternal>(OperatorType::ToString, std::move(exp));
	default:
		return nullptr;
	}
}